

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ReduceRightHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  ulong uVar1;
  code *pcVar2;
  unsigned_long uVar3;
  Var pvVar4;
  Var pvVar5;
  bool bVar6;
  BOOL BVar7;
  uint32 uVar8;
  int iVar9;
  ThreadContext *pTVar10;
  Var pvVar11;
  undefined4 extraout_var;
  JavascriptLibrary *this;
  RecyclableObject *pRVar12;
  undefined4 *puVar13;
  unsigned_long *puVar14;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var15;
  Var pvVar16;
  CallInfo local_f8;
  CallInfo local_f0;
  undefined1 local_e8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  uint32 end_1;
  Var undefinedValue;
  ulong uStack_b8;
  BOOL hasItem;
  uint local_b0;
  byte local_a9;
  uint32 end;
  bool bPresent;
  unsigned_long index;
  unsigned_long k;
  Var element;
  Var accumulator;
  RecyclableObject *callBackFn;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  args_local = (Arguments *)length;
  length_local = (unsigned_long)obj;
  obj_local = (RecyclableObject *)typedArrayBase;
  typedArrayBase_local = (TypedArrayBase *)pArr;
  pTVar10 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_70,pTVar10);
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,typedArrayBase_local);
  if (1 < (SUB84(args->Info,0) & 0xffffff)) {
    pvVar11 = Arguments::operator[](args,1);
    bVar6 = JavascriptConversion::IsCallable(pvVar11);
    if (bVar6) {
      if (((obj_local == (RecyclableObject *)0x0) && (typedArrayBase_local == (TypedArrayBase *)0x0)
          ) && (bVar6 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>
                                  ((RecyclableObject *)length_local), bVar6)) {
        obj_local = (RecyclableObject *)
                    UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>
                              ((RecyclableObject *)length_local);
      }
      pvVar11 = Arguments::operator[](args,1);
      accumulator = VarTo<Js::RecyclableObject>(pvVar11);
      element = (Var)0x0;
      k = 0;
      index = 0;
      _end = (undefined1 *)0x0;
      if ((SUB84(args->Info,0) & 0xffffff) < 3) {
        if (args_local == (Arguments *)0x0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5fe43,(PCWSTR)0x0);
        }
        local_a9 = 0;
        if (obj_local == (RecyclableObject *)0x0) {
          for (; index < args_local && (local_a9 & 1) == 0; index = index + 1) {
            _end = &(args_local->Info).field_0x0 + ~index;
            JsReentLock::unlock((JsReentLock *)local_70);
            BVar7 = Js::JavascriptOperators::HasItem((RecyclableObject *)length_local,(uint64)_end);
            JsReentLock::MutateArrayObject((JsReentLock *)local_70);
            JsReentLock::relock((JsReentLock *)local_70);
            if (BVar7 != 0) {
              JsReentLock::unlock((JsReentLock *)local_70);
              element = Js::JavascriptOperators::GetItem
                                  ((RecyclableObject *)length_local,(uint64)_end,
                                   (ScriptContext *)jsReentLock._24_8_);
              JsReentLock::MutateArrayObject((JsReentLock *)local_70);
              JsReentLock::relock((JsReentLock *)local_70);
              local_a9 = 1;
            }
          }
        }
        else {
          bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar6) {
            bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
            if (!bVar6) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x2832,"(VarIsCorrectType(typedArrayBase))",
                                          "VarIsCorrectType(typedArrayBase)");
              if (!bVar6) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
            Throw::FatalInternalError(-0x7fffbffb);
          }
          uVar8 = ArrayObject::GetLength((ArrayObject *)obj_local);
          uStack_b8 = (ulong)uVar8;
          puVar14 = min<unsigned_long>((unsigned_long *)&args_local,&stack0xffffffffffffff48);
          local_b0 = (uint)*puVar14;
          for (; index < local_b0 && (local_a9 & 1) == 0; index = index + 1) {
            _end = &(args_local->Info).field_0x0 + ~index;
            iVar9 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)_end & 0xffffffff);
            k = CONCAT44(extraout_var,iVar9);
            local_a9 = 1;
            element = (Var)k;
          }
        }
        if ((local_a9 & 1) == 0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5fe43,(PCWSTR)0x0);
        }
      }
      else {
        element = Arguments::operator[](args,2);
      }
      this = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      pRVar12 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      if (obj_local == (RecyclableObject *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_70);
        pArr_local = (JavascriptArray *)
                     ReduceRightObjectHelper<unsigned_long>
                               ((RecyclableObject *)length_local,(unsigned_long)args_local,index,
                                (RecyclableObject *)accumulator,element,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
        if (!bVar6) {
          bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar6) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2856,"(VarIsCorrectType(typedArrayBase))",
                                        "VarIsCorrectType(typedArrayBase)");
            if (!bVar6) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
        uVar8 = ArrayObject::GetLength((ArrayObject *)obj_local);
        autoReentrancyHandler._8_8_ = ZEXT48(uVar8);
        puVar14 = min<unsigned_long>((unsigned_long *)&args_local,
                                     (unsigned_long *)
                                     &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
        uVar1 = *puVar14;
        for (; index < (uVar1 & 0xffffffff); index = index + 1) {
          _end = &(args_local->Info).field_0x0 + ~index;
          iVar9 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)_end & 0xffffffff);
          k = CONCAT44(extraout_var_00,iVar9);
          JsReentLock::unlock((JsReentLock *)local_70);
          pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_e8,pTVar10);
          pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar10);
          pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::AssertJsReentrancy(pTVar10);
          pvVar11 = accumulator;
          p_Var15 = RecyclableObject::GetEntryPoint((RecyclableObject *)accumulator);
          CheckIsExecutable((RecyclableObject *)pvVar11,p_Var15);
          p_Var15 = RecyclableObject::GetEntryPoint((RecyclableObject *)accumulator);
          pvVar4 = accumulator;
          CallInfo::CallInfo(&local_f0,CallFlags_Value,5);
          pvVar5 = accumulator;
          CallInfo::CallInfo(&local_f8,CallFlags_Value,5);
          pvVar11 = element;
          uVar3 = k;
          pvVar16 = JavascriptNumber::ToVar((uint64)_end,(ScriptContext *)jsReentLock._24_8_);
          element = (*p_Var15)((RecyclableObject *)pvVar4,(CallInfo)pvVar5,local_f0,0,0,0,0,local_f8
                               ,pRVar12,pvVar11,uVar3,pvVar16,obj_local);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_e8);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          JsReentLock::relock((JsReentLock *)local_70);
        }
        pArr_local = (JavascriptArray *)element;
      }
      JsReentLock::~JsReentLock((JsReentLock *)local_70);
      return pArr_local;
    }
  }
  if (obj_local != (RecyclableObject *)0x0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"[TypedArray].prototype.reduceRight"
              );
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.reduceRight");
}

Assistant:

Var JavascriptArray::ReduceRightHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduceRight"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduceRight"));
            }
        }

        // If we came from Array.prototype.reduceRight and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;
        T k = 0;
        T index = 0;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }

            bool bPresent = false;
            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    index = length - k - 1;
                    element = typedArrayBase->DirectGetItem((uint32)index);
                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    index = length - k - 1;
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, index));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, index, scriptContext));
                        bPresent = true;
                    }
                }
            }
            if (bPresent == false)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }
        }

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                index = length - k - 1;
                element = typedArrayBase->DirectGetItem((uint32)index);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(index, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }